

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O0

void __thiscall
btDbvtBroadphase::destroyProxy
          (btDbvtBroadphase *this,btBroadphaseProxy *absproxy,btDispatcher *dispatcher)

{
  undefined8 in_RDX;
  btDbvtProxy *in_RSI;
  long in_RDI;
  btDbvtProxy *proxy;
  
  if (in_RSI->stage == 2) {
    btDbvt::remove((btDbvt *)(in_RDI + 0x68),(char *)in_RSI->leaf);
  }
  else {
    btDbvt::remove((btDbvt *)(in_RDI + 8),(char *)in_RSI->leaf);
  }
  listremove<btDbvtProxy>(in_RSI,(btDbvtProxy **)(in_RDI + 200 + (long)in_RSI->stage * 8));
  (**(code **)(**(long **)(in_RDI + 0xe0) + 0x20))(*(long **)(in_RDI + 0xe0),in_RSI,in_RDX);
  btAlignedFreeInternal((void *)0x16100d);
  *(undefined1 *)(in_RDI + 0x11e) = 1;
  return;
}

Assistant:

void							btDbvtBroadphase::destroyProxy(	btBroadphaseProxy* absproxy,
															   btDispatcher* dispatcher)
{
	btDbvtProxy*	proxy=(btDbvtProxy*)absproxy;
	if(proxy->stage==STAGECOUNT)
		m_sets[1].remove(proxy->leaf);
	else
		m_sets[0].remove(proxy->leaf);
	listremove(proxy,m_stageRoots[proxy->stage]);
	m_paircache->removeOverlappingPairsContainingProxy(proxy,dispatcher);
	btAlignedFree(proxy);
	m_needcleanup=true;
}